

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::Shutdown(ImGuiContext_conflict1 *context)

{
  int *piVar1;
  ImFontAtlas *p;
  char *pcVar2;
  ImGuiContextHook *pIVar3;
  ImGuiWindow_conflict **ppIVar4;
  ImGuiWindowStackData *pIVar5;
  ImGuiColorMod *pIVar6;
  ImGuiStyleMod *pIVar7;
  ImFont **ppIVar8;
  ImGuiPopupData *pIVar9;
  ImGuiViewportP_conflict **ppIVar10;
  ImGuiPtrOrIndex *pIVar11;
  ImGuiShrinkWidthItem *pIVar12;
  ImGuiTableTempData *pIVar13;
  void *pvVar14;
  ImDrawChannel *pIVar15;
  uint *puVar16;
  ImGuiSettingsHandler_conflict1 *pIVar17;
  FILE *__stream;
  ImGuiContext_conflict1 *pIVar18;
  int iVar19;
  ImGuiContext_conflict1 *g;
  ImGuiContext_conflict1 *backup_context;
  long lVar20;
  long lVar21;
  
  p = (context->IO).Fonts;
  if ((p != (ImFontAtlas *)0x0) && (context->FontAtlasOwnedByContext == true)) {
    p->Locked = false;
    IM_DELETE<ImFontAtlas>(p);
  }
  (context->IO).Fonts = (ImFontAtlas *)0x0;
  pIVar18 = GImGui;
  if (context->Initialized == true) {
    if ((context->SettingsLoaded != false) &&
       (pcVar2 = (context->IO).IniFilename, pcVar2 != (char *)0x0)) {
      GImGui = context;
      SaveIniSettingsToDisk(pcVar2);
    }
    GImGui = context;
    DestroyPlatformWindows();
    GImGui = pIVar18;
    DockContextShutdown(context);
    iVar19 = (context->Hooks).Size;
    if (0 < iVar19) {
      lVar20 = 0;
      lVar21 = 0;
      do {
        pIVar3 = (context->Hooks).Data;
        if (*(int *)((long)&pIVar3->Type + lVar20) == 6) {
          (**(code **)((long)&pIVar3->Callback + lVar20))(context,(long)&pIVar3->HookId + lVar20);
          iVar19 = (context->Hooks).Size;
        }
        lVar21 = lVar21 + 1;
        lVar20 = lVar20 + 0x20;
      } while (lVar21 < iVar19);
    }
    if (0 < (context->Windows).Size) {
      lVar20 = 0;
      do {
        IM_DELETE<ImGuiWindow>((context->Windows).Data[lVar20]);
        lVar20 = lVar20 + 1;
      } while (lVar20 < (context->Windows).Size);
    }
    ppIVar4 = (context->Windows).Data;
    if (ppIVar4 != (ImGuiWindow_conflict **)0x0) {
      (context->Windows).Size = 0;
      (context->Windows).Capacity = 0;
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
      (context->Windows).Data = (ImGuiWindow_conflict **)0x0;
    }
    ppIVar4 = (context->WindowsFocusOrder).Data;
    if (ppIVar4 != (ImGuiWindow_conflict **)0x0) {
      (context->WindowsFocusOrder).Size = 0;
      (context->WindowsFocusOrder).Capacity = 0;
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
      (context->WindowsFocusOrder).Data = (ImGuiWindow_conflict **)0x0;
    }
    ppIVar4 = (context->WindowsTempSortBuffer).Data;
    if (ppIVar4 != (ImGuiWindow_conflict **)0x0) {
      (context->WindowsTempSortBuffer).Size = 0;
      (context->WindowsTempSortBuffer).Capacity = 0;
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
      (context->WindowsTempSortBuffer).Data = (ImGuiWindow_conflict **)0x0;
    }
    context->CurrentWindow = (ImGuiWindow_conflict *)0x0;
    pIVar5 = (context->CurrentWindowStack).Data;
    if (pIVar5 != (ImGuiWindowStackData *)0x0) {
      (context->CurrentWindowStack).Size = 0;
      (context->CurrentWindowStack).Capacity = 0;
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
      (context->CurrentWindowStack).Data = (ImGuiWindowStackData *)0x0;
    }
    ImGuiStorage::Clear(&context->WindowsById);
    context->NavWindow = (ImGuiWindow_conflict *)0x0;
    context->ActiveIdPreviousFrameWindow = (ImGuiWindow_conflict *)0x0;
    context->ActiveIdWindow = (ImGuiWindow_conflict *)0x0;
    context->MovingWindow = (ImGuiWindow_conflict *)0x0;
    context->HoveredWindow = (ImGuiWindow_conflict *)0x0;
    context->HoveredWindowUnderMovingWindow = (ImGuiWindow_conflict *)0x0;
    pIVar6 = (context->ColorStack).Data;
    if (pIVar6 != (ImGuiColorMod *)0x0) {
      (context->ColorStack).Size = 0;
      (context->ColorStack).Capacity = 0;
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
      (context->ColorStack).Data = (ImGuiColorMod *)0x0;
    }
    pIVar7 = (context->StyleVarStack).Data;
    if (pIVar7 != (ImGuiStyleMod *)0x0) {
      (context->StyleVarStack).Size = 0;
      (context->StyleVarStack).Capacity = 0;
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar7,GImAllocatorUserData);
      (context->StyleVarStack).Data = (ImGuiStyleMod *)0x0;
    }
    ppIVar8 = (context->FontStack).Data;
    if (ppIVar8 != (ImFont **)0x0) {
      (context->FontStack).Size = 0;
      (context->FontStack).Capacity = 0;
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar8,GImAllocatorUserData);
      (context->FontStack).Data = (ImFont **)0x0;
    }
    pIVar9 = (context->OpenPopupStack).Data;
    if (pIVar9 != (ImGuiPopupData *)0x0) {
      (context->OpenPopupStack).Size = 0;
      (context->OpenPopupStack).Capacity = 0;
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar9,GImAllocatorUserData);
      (context->OpenPopupStack).Data = (ImGuiPopupData *)0x0;
    }
    pIVar9 = (context->BeginPopupStack).Data;
    if (pIVar9 != (ImGuiPopupData *)0x0) {
      (context->BeginPopupStack).Size = 0;
      (context->BeginPopupStack).Capacity = 0;
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar9,GImAllocatorUserData);
      (context->BeginPopupStack).Data = (ImGuiPopupData *)0x0;
    }
    context->CurrentViewport = (ImGuiViewportP_conflict1 *)0x0;
    context->MouseViewport = (ImGuiViewportP_conflict1 *)0x0;
    context->MouseLastHoveredViewport = (ImGuiViewportP_conflict1 *)0x0;
    if (0 < (context->Viewports).Size) {
      lVar20 = 0;
      do {
        IM_DELETE<ImGuiViewportP>((ImGuiViewportP_conflict1 *)(context->Viewports).Data[lVar20]);
        lVar20 = lVar20 + 1;
      } while (lVar20 < (context->Viewports).Size);
    }
    ppIVar10 = (context->Viewports).Data;
    if (ppIVar10 != (ImGuiViewportP_conflict **)0x0) {
      (context->Viewports).Size = 0;
      (context->Viewports).Capacity = 0;
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar10,GImAllocatorUserData);
      (context->Viewports).Data = (ImGuiViewportP_conflict **)0x0;
    }
    ImPool<ImGuiTabBar>::Clear(&context->TabBars);
    pIVar11 = (context->CurrentTabBarStack).Data;
    if (pIVar11 != (ImGuiPtrOrIndex *)0x0) {
      (context->CurrentTabBarStack).Size = 0;
      (context->CurrentTabBarStack).Capacity = 0;
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar11,GImAllocatorUserData);
      (context->CurrentTabBarStack).Data = (ImGuiPtrOrIndex *)0x0;
    }
    pIVar12 = (context->ShrinkWidthBuffer).Data;
    if (pIVar12 != (ImGuiShrinkWidthItem *)0x0) {
      (context->ShrinkWidthBuffer).Size = 0;
      (context->ShrinkWidthBuffer).Capacity = 0;
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar12,GImAllocatorUserData);
      (context->ShrinkWidthBuffer).Data = (ImGuiShrinkWidthItem *)0x0;
    }
    ImPool<ImGuiTable>::Clear(&context->Tables);
    if (0 < (context->TablesTempDataStack).Size) {
      lVar20 = 0x10;
      lVar21 = 0;
      do {
        pIVar13 = (context->TablesTempDataStack).Data;
        ImDrawListSplitter::ClearFreeMemory
                  ((ImDrawListSplitter *)((long)&pIVar13->TableIndex + lVar20));
        pvVar14 = *(void **)((long)&(pIVar13->DrawSplitter)._Current + lVar20);
        if (pvVar14 != (void *)0x0) {
          if (GImGui != (ImGuiContext_conflict1 *)0x0) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pvVar14,GImAllocatorUserData);
        }
        lVar21 = lVar21 + 1;
        lVar20 = lVar20 + 0x70;
      } while (lVar21 < (context->TablesTempDataStack).Size);
    }
    pIVar13 = (context->TablesTempDataStack).Data;
    if (pIVar13 != (ImGuiTableTempData *)0x0) {
      (context->TablesTempDataStack).Size = 0;
      (context->TablesTempDataStack).Capacity = 0;
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar13,GImAllocatorUserData);
      (context->TablesTempDataStack).Data = (ImGuiTableTempData *)0x0;
    }
    pIVar15 = (context->DrawChannelsTempMergeBuffer).Data;
    if (pIVar15 != (ImDrawChannel *)0x0) {
      (context->DrawChannelsTempMergeBuffer).Size = 0;
      (context->DrawChannelsTempMergeBuffer).Capacity = 0;
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar15,GImAllocatorUserData);
      (context->DrawChannelsTempMergeBuffer).Data = (ImDrawChannel *)0x0;
    }
    pcVar2 = (context->ClipboardHandlerData).Data;
    if (pcVar2 != (char *)0x0) {
      (context->ClipboardHandlerData).Size = 0;
      (context->ClipboardHandlerData).Capacity = 0;
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
      (context->ClipboardHandlerData).Data = (char *)0x0;
    }
    puVar16 = (context->MenusIdSubmittedThisFrame).Data;
    if (puVar16 != (uint *)0x0) {
      (context->MenusIdSubmittedThisFrame).Size = 0;
      (context->MenusIdSubmittedThisFrame).Capacity = 0;
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar16,GImAllocatorUserData);
      (context->MenusIdSubmittedThisFrame).Data = (uint *)0x0;
    }
    ImGuiInputTextState::ClearFreeMemory(&context->InputTextState);
    ImChunkStream<ImGuiWindowSettings>::clear(&context->SettingsWindows);
    pIVar17 = (context->SettingsHandlers).Data;
    if (pIVar17 != (ImGuiSettingsHandler_conflict1 *)0x0) {
      (context->SettingsHandlers).Size = 0;
      (context->SettingsHandlers).Capacity = 0;
      if (GImGui != (ImGuiContext_conflict1 *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar17,GImAllocatorUserData);
      (context->SettingsHandlers).Data = (ImGuiSettingsHandler_conflict1 *)0x0;
    }
    __stream = (FILE *)context->LogFile;
    if (__stream != (FILE *)0x0) {
      if (__stream != _stdout) {
        fclose(__stream);
      }
      context->LogFile = (ImFileHandle)0x0;
    }
    ImGuiTextBuffer::clear(&context->LogBuffer);
    context->Initialized = false;
  }
  return;
}

Assistant:

void ImGui::Shutdown(ImGuiContext* context)
{
    // The fonts atlas can be used prior to calling NewFrame(), so we clear it even if g.Initialized is FALSE (which would happen if we never called NewFrame)
    ImGuiContext& g = *context;
    if (g.IO.Fonts && g.FontAtlasOwnedByContext)
    {
        g.IO.Fonts->Locked = false;
        IM_DELETE(g.IO.Fonts);
    }
    g.IO.Fonts = NULL;

    // Cleanup of other data are conditional on actually having initialized Dear ImGui.
    if (!g.Initialized)
        return;

    // Save settings (unless we haven't attempted to load them: CreateContext/DestroyContext without a call to NewFrame shouldn't save an empty file)
    if (g.SettingsLoaded && g.IO.IniFilename != NULL)
    {
        ImGuiContext* backup_context = GImGui;
        SetCurrentContext(&g);
        SaveIniSettingsToDisk(g.IO.IniFilename);
        SetCurrentContext(backup_context);
    }

    // Destroy platform windows
    ImGuiContext* backup_context = ImGui::GetCurrentContext();
    SetCurrentContext(context);
    DestroyPlatformWindows();
    SetCurrentContext(backup_context);

    // Shutdown extensions
    DockContextShutdown(&g);

    CallContextHooks(&g, ImGuiContextHookType_Shutdown);

    // Clear everything else
    g.Windows.clear_delete();
    g.WindowsFocusOrder.clear();
    g.WindowsTempSortBuffer.clear();
    g.CurrentWindow = NULL;
    g.CurrentWindowStack.clear();
    g.WindowsById.Clear();
    g.NavWindow = NULL;
    g.HoveredWindow = g.HoveredWindowUnderMovingWindow = NULL;
    g.ActiveIdWindow = g.ActiveIdPreviousFrameWindow = NULL;
    g.MovingWindow = NULL;
    g.ColorStack.clear();
    g.StyleVarStack.clear();
    g.FontStack.clear();
    g.OpenPopupStack.clear();
    g.BeginPopupStack.clear();

    g.CurrentViewport = g.MouseViewport = g.MouseLastHoveredViewport = NULL;
    g.Viewports.clear_delete();

    g.TabBars.Clear();
    g.CurrentTabBarStack.clear();
    g.ShrinkWidthBuffer.clear();

    g.Tables.Clear();
    g.TablesTempDataStack.clear_destruct();
    g.DrawChannelsTempMergeBuffer.clear();

    g.ClipboardHandlerData.clear();
    g.MenusIdSubmittedThisFrame.clear();
    g.InputTextState.ClearFreeMemory();

    g.SettingsWindows.clear();
    g.SettingsHandlers.clear();

    if (g.LogFile)
    {
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
        if (g.LogFile != stdout)
#endif
            ImFileClose(g.LogFile);
        g.LogFile = NULL;
    }
    g.LogBuffer.clear();

    g.Initialized = false;
}